

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O3

int ctemplate_htmlparser::jsparser_buffer_set(jsparser_ctx *js,int pos,char value)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  if (pos < 0) {
    iVar3 = 0;
    if (0xffffffee < (uint)pos) {
      iVar1 = js->buffer_end;
      iVar6 = iVar1 - js->buffer_start;
      iVar5 = (iVar1 + 0x12) - js->buffer_start;
      if (-1 < iVar6) {
        iVar5 = iVar6;
      }
      if (-iVar5 <= pos) {
        uVar4 = (iVar1 + pos) % 0x12;
        uVar2 = uVar4 + 0x12;
        if (-1 < (int)uVar4) {
          uVar2 = uVar4;
        }
        js->buffer[uVar2] = value;
        iVar3 = 1;
      }
    }
    return iVar3;
  }
  __assert_fail("pos < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0x11b,"int ctemplate_htmlparser::jsparser_buffer_set(jsparser_ctx *, int, char)");
}

Assistant:

int jsparser_buffer_set(jsparser_ctx *js, int pos, char value)
{
  int absolute_pos;
  assert(pos < 0);

  absolute_pos = jsparser_buffer_absolute_pos(js, pos);
  if (absolute_pos < 0) {
    return 0;
  }

  js->buffer[absolute_pos] = value;
  return 1;
}